

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O3

void __thiscall Dumper::dumpNodeEdges(Dumper *this,RWNode *node)

{
  undefined8 *puVar1;
  RWNode *pRVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  RWCalledValue *cv;
  long *plVar7;
  undefined8 *puVar8;
  pair<std::_Rb_tree_iterator<dg::dda::RWNode_*>,_bool> pVar9;
  RWNode *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  long local_30;
  
  local_48 = node;
  if (dumpNodeEdges(dg::dda::RWNode*)::dumped == '\0') {
    dumpNodeEdges();
  }
  pVar9 = std::
          _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
          ::_M_insert_unique<dg::dda::RWNode*const&>
                    ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                      *)&dumpNodeEdges::dumped,&local_48);
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if ((verbose[0x80] != '\0') || (*(int *)(local_48 + 0x90) - 6U < 5)) {
      puVar1 = *(undefined8 **)(local_48 + 0x138);
      for (puVar8 = *(undefined8 **)(local_48 + 0x130); puVar8 != puVar1; puVar8 = puVar8 + 1) {
        printf("\tNODE%p->NODE%p [style=dotted constraint=false]\n",*puVar8,local_48);
      }
    }
    if ((graph_only[0x80] == '\0') &&
       (lVar5 = (**(code **)(*(long *)local_48 + 0x18))(local_48), *(long *)(lVar5 + 0x88) != 0)) {
      plVar7 = *(long **)(this->DDA->DDA)._M_t.
                         super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                         .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>.
                         _M_head_impl;
      (**(code **)(*plVar7 + 0x20))(&local_40,plVar7,local_48);
      for (puVar8 = local_40; puVar8 != local_38; puVar8 = puVar8 + 1) {
        pRVar2 = (RWNode *)*puVar8;
        nodeToDot(this,pRVar2);
        printf("\tNODE%p->NODE%p [style=dotted constraint=false color=blue]\n",pRVar2,local_48);
      }
      if (local_40 != (undefined8 *)0x0) {
        operator_delete(local_40,local_30 - (long)local_40);
      }
    }
    pRVar2 = local_48;
    if ((local_48 != (RWNode *)0x0) && (*(int *)(local_48 + 0x90) == 0xd)) {
      plVar3 = *(long **)(local_48 + 0x160);
      for (plVar7 = *(long **)(local_48 + 0x158); plVar7 != plVar3; plVar7 = plVar7 + 2) {
        if ((undefined8 *)*plVar7 == (undefined8 *)0x0) {
          printf("\tNODE%p->NODE%p [style=dashed constraint=false color=blue]\n",pRVar2,plVar7[1]);
        }
        else {
          lVar5 = **(long **)*plVar7;
          lVar4 = *(long *)(lVar5 + 0x38);
          if (lVar4 == lVar5 + 0x38) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(undefined8 *)(lVar4 + 0x10);
          }
          printf("\tNODE%p->NODE%p [penwidth=4 color=blue ltail=cluster_subg_%p]\n",pRVar2,uVar6);
        }
      }
    }
  }
  return;
}

Assistant:

void dumpNodeEdges(RWNode *node) {
        static std::set<RWNode *> dumped;
        if (!dumped.insert(node).second)
            return;

        if (verbose || node->isPhi()) {
            for (RWNode *def : node->defuse) {
                printf("\tNODE%p->NODE%p [style=dotted constraint=false]\n",
                       static_cast<void *>(def), static_cast<void *>(node));
            }
        }
        if (!graph_only && node->isUse()) {
            for (RWNode *def : DDA->getDefinitions(node)) {
                nodeToDot(def);
                printf("\tNODE%p->NODE%p [style=dotted constraint=false "
                       "color=blue]\n",
                       static_cast<void *>(def), static_cast<void *>(node));
            }
        }
        if (auto *C = RWNodeCall::get(node)) {
            for (auto &cv : C->getCallees()) {
                if (auto *s = cv.getSubgraph()) {
                    assert(s->getRoot() && "Subgraph has no root");
                    printf("\tNODE%p->NODE%p "
                           "[penwidth=4 color=blue "
                           "ltail=cluster_subg_%p]\n",
                           static_cast<void *>(C),
                           static_cast<const void *>(s->getRoot()), s);
                } else {
                    printf("\tNODE%p->NODE%p [style=dashed constraint=false "
                           "color=blue]\n",
                           static_cast<void *>(C),
                           static_cast<void *>(cv.getCalledValue()));
                }
            }
        }
    }